

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_scandir_file(void)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uint uVar3;
  int extraout_EAX_01;
  int iVar4;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar5;
  uv_loop_t *extraout_RAX;
  uv_loop_t *puVar6;
  __off64_t _Var7;
  uv_buf_t *bufs;
  uv_fs_t *unaff_RBX;
  char *pcVar8;
  uv_fs_t *puVar9;
  ulong uVar10;
  uv_fs_t *unaff_R14;
  long lVar11;
  char *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uv_buf_t uVar15;
  char acStack_672 [2];
  uv_loop_t *puStack_670;
  uv_buf_t uStack_5e8;
  uv_buf_t uStack_5d8;
  uv_loop_t *puStack_5c0;
  uv_fs_t *puStack_5b8;
  uv_fs_t *puStack_5b0;
  uv_buf_t uStack_578;
  uv_buf_t uStack_568;
  uv_buf_t uStack_558;
  uv_buf_t uStack_548;
  char acStack_538 [256];
  char acStack_438 [256];
  char acStack_338 [128];
  char acStack_2b8 [136];
  uv_loop_t *puStack_230;
  uv_fs_t *puStack_228;
  uv_loop_t *puStack_220;
  uv_fs_t uStack_1d8;
  uv_loop_t *puStack_20;
  
  loop = uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  iVar2 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test/fixtures/empty_file",0,(uv_fs_cb)0x0);
  if (iVar2 == -0x14) {
    unaff_RBX = &scandir_req;
    uv_fs_req_cleanup(&scandir_req);
    puVar5 = loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"test/fixtures/empty_file",0,file_scandir_cb);
    if (iVar2 != 0) goto LAB_001549e2;
    if (scandir_cb_count != 0) goto LAB_001549e7;
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_001549ec;
    unaff_RBX = (uv_fs_t *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_scandir_file_cold_1();
LAB_001549e2:
    run_test_fs_scandir_file_cold_2();
LAB_001549e7:
    run_test_fs_scandir_file_cold_3();
LAB_001549ec:
    run_test_fs_scandir_file_cold_4();
  }
  run_test_fs_scandir_file_cold_5();
  if (puVar5 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00154a39;
    if (scandir_req.result != -0x14) goto LAB_00154a3e;
    if (scandir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return extraout_EAX;
    }
  }
  else {
    file_scandir_cb_cold_1();
LAB_00154a39:
    file_scandir_cb_cold_2();
LAB_00154a3e:
    file_scandir_cb_cold_3();
  }
  file_scandir_cb_cold_4();
  puStack_20 = (uv_loop_t *)unaff_RBX;
  loop = uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&uStack_1d8,".",0,0,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    run_test_fs_open_dir_cold_1();
LAB_00154b46:
    run_test_fs_open_dir_cold_2();
LAB_00154b4b:
    run_test_fs_open_dir_cold_3();
LAB_00154b50:
    run_test_fs_open_dir_cold_4();
LAB_00154b55:
    run_test_fs_open_dir_cold_5();
LAB_00154b5a:
    run_test_fs_open_dir_cold_6();
LAB_00154b5f:
    run_test_fs_open_dir_cold_7();
  }
  else {
    if (uStack_1d8.result < 0) goto LAB_00154b46;
    if (uStack_1d8.ptr != (void *)0x0) goto LAB_00154b4b;
    uv_fs_req_cleanup(&uStack_1d8);
    puVar5 = (uv_loop_t *)0x0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&uStack_1d8,iVar2,(uv_fs_cb)0x0);
    unaff_R14 = &uStack_1d8;
    if (iVar2 != 0) goto LAB_00154b50;
    puVar5 = loop;
    iVar2 = uv_fs_open(loop,&uStack_1d8,".",0,0,open_cb_simple);
    unaff_R14 = &uStack_1d8;
    if (iVar2 != 0) goto LAB_00154b55;
    unaff_R14 = &uStack_1d8;
    if (open_cb_count != 0) goto LAB_00154b5a;
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    unaff_R14 = &uStack_1d8;
    if (open_cb_count != 1) goto LAB_00154b5f;
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    unaff_R14 = &uStack_1d8;
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_fs_open_dir_cold_8();
  if (puVar5->backend_fd == 1) {
    puVar6 = (uv_loop_t *)puVar5->watcher_queue[0];
    if ((long)puVar6 < 0) goto LAB_00154b91;
    open_cb_count = open_cb_count + 1;
    puVar6 = puVar5;
    if (puVar5->watchers != (uv__io_t **)0x0) {
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return extraout_EAX_00;
    }
  }
  else {
    open_cb_simple_cold_1();
    puVar6 = extraout_RAX;
LAB_00154b91:
    open_cb_simple_cold_3();
  }
  iVar2 = (int)puVar6;
  open_cb_simple_cold_2();
  fs_file_open_append(iVar2);
  fs_file_open_append(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_file_open_append_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fs_file_open_append_cold_1();
LAB_00154f1a:
    fs_file_open_append_cold_2();
LAB_00154f1f:
    fs_file_open_append_cold_3();
LAB_00154f24:
    fs_file_open_append_cold_4();
LAB_00154f29:
    fs_file_open_append_cold_5();
LAB_00154f2e:
    fs_file_open_append_cold_6();
LAB_00154f33:
    fs_file_open_append_cold_7();
LAB_00154f38:
    fs_file_open_append_cold_8();
LAB_00154f3d:
    fs_file_open_append_cold_9();
LAB_00154f42:
    fs_file_open_append_cold_10();
LAB_00154f47:
    fs_file_open_append_cold_11();
LAB_00154f4c:
    fs_file_open_append_cold_12();
LAB_00154f51:
    fs_file_open_append_cold_13();
LAB_00154f56:
    fs_file_open_append_cold_14();
LAB_00154f5b:
    fs_file_open_append_cold_15();
LAB_00154f60:
    fs_file_open_append_cold_16();
LAB_00154f65:
    fs_file_open_append_cold_17();
LAB_00154f6a:
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00154f1a;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00154f1f;
    if (write_req.result < 0) goto LAB_00154f24;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00154f29;
    if (close_req.result != 0) goto LAB_00154f2e;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x402,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00154f33;
    if (open_req1.result._4_4_ < 0) goto LAB_00154f38;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(test_buf,0xd);
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00154f3d;
    if (write_req.result < 0) goto LAB_00154f42;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00154f47;
    if (close_req.result != 0) goto LAB_00154f4c;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0x100,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00154f51;
    if (open_req1.result._4_4_ < 0) goto LAB_00154f56;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(buf,0x20);
    iov = uVar15;
    uVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_00154f5b;
    if (read_req.result != 0x1a) goto LAB_00154f60;
    auVar14[0] = -(buf[10] == 'r');
    auVar14[1] = -(buf[0xb] == '\n');
    auVar14[2] = -(buf[0xc] == '\0');
    auVar14[3] = -(buf[0xd] == 't');
    auVar14[4] = -(buf[0xe] == 'e');
    auVar14[5] = -(buf[0xf] == 's');
    auVar14[6] = -(buf[0x10] == 't');
    auVar14[7] = -(buf[0x11] == '-');
    auVar14[8] = -(buf[0x12] == 'b');
    auVar14[9] = -(buf[0x13] == 'u');
    auVar14[10] = -(buf[0x14] == 'f');
    auVar14[0xb] = -(buf[0x15] == 'f');
    auVar14[0xc] = -(buf[0x16] == 'e');
    auVar14[0xd] = -(buf[0x17] == 'r');
    auVar14[0xe] = -(buf[0x18] == '\n');
    auVar14[0xf] = -(buf[0x19] == '\0');
    auVar13[0] = -(buf[0] == 't');
    auVar13[1] = -(buf[1] == 'e');
    auVar13[2] = -(buf[2] == 's');
    auVar13[3] = -(buf[3] == 't');
    auVar13[4] = -(buf[4] == '-');
    auVar13[5] = -(buf[5] == 'b');
    auVar13[6] = -(buf[6] == 'u');
    auVar13[7] = -(buf[7] == 'f');
    auVar13[8] = -(buf[8] == 'f');
    auVar13[9] = -(buf[9] == 'e');
    auVar13[10] = -(buf[10] == 'r');
    auVar13[0xb] = -(buf[0xb] == '\n');
    auVar13[0xc] = -(buf[0xc] == '\0');
    auVar13[0xd] = -(buf[0xd] == 't');
    auVar13[0xe] = -(buf[0xe] == 'e');
    auVar13[0xf] = -(buf[0xf] == 's');
    auVar13 = auVar13 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00154f65;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00154f6a;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  fs_file_open_append_cold_19();
  puVar5 = (uv_loop_t *)0x194395;
  puStack_220 = (uv_loop_t *)0x154f88;
  unlink("test_file");
  puStack_220 = (uv_loop_t *)0x154f94;
  unlink("test_file2");
  puStack_220 = (uv_loop_t *)0x154f99;
  loop = uv_default_loop();
  iVar4 = 0;
  puStack_220 = (uv_loop_t *)0x154fbf;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    puStack_220 = (uv_loop_t *)0x1552b5;
    run_test_fs_rename_to_existing_file_cold_1();
LAB_001552b5:
    puStack_220 = (uv_loop_t *)0x1552ba;
    run_test_fs_rename_to_existing_file_cold_2();
LAB_001552ba:
    puStack_220 = (uv_loop_t *)0x1552bf;
    run_test_fs_rename_to_existing_file_cold_3();
LAB_001552bf:
    puStack_220 = (uv_loop_t *)0x1552c4;
    run_test_fs_rename_to_existing_file_cold_4();
LAB_001552c4:
    puStack_220 = (uv_loop_t *)0x1552c9;
    run_test_fs_rename_to_existing_file_cold_5();
LAB_001552c9:
    puStack_220 = (uv_loop_t *)0x1552ce;
    run_test_fs_rename_to_existing_file_cold_6();
LAB_001552ce:
    puStack_220 = (uv_loop_t *)0x1552d3;
    run_test_fs_rename_to_existing_file_cold_7();
LAB_001552d3:
    puStack_220 = (uv_loop_t *)0x1552d8;
    run_test_fs_rename_to_existing_file_cold_8();
LAB_001552d8:
    puStack_220 = (uv_loop_t *)0x1552dd;
    run_test_fs_rename_to_existing_file_cold_9();
LAB_001552dd:
    puStack_220 = (uv_loop_t *)0x1552e2;
    run_test_fs_rename_to_existing_file_cold_10();
LAB_001552e2:
    puStack_220 = (uv_loop_t *)0x1552e7;
    run_test_fs_rename_to_existing_file_cold_11();
LAB_001552e7:
    puStack_220 = (uv_loop_t *)0x1552ec;
    run_test_fs_rename_to_existing_file_cold_12();
LAB_001552ec:
    puStack_220 = (uv_loop_t *)0x1552f1;
    run_test_fs_rename_to_existing_file_cold_13();
LAB_001552f1:
    puStack_220 = (uv_loop_t *)0x1552f6;
    run_test_fs_rename_to_existing_file_cold_14();
LAB_001552f6:
    puStack_220 = (uv_loop_t *)0x1552fb;
    run_test_fs_rename_to_existing_file_cold_15();
LAB_001552fb:
    puStack_220 = (uv_loop_t *)0x155300;
    run_test_fs_rename_to_existing_file_cold_16();
LAB_00155300:
    puStack_220 = (uv_loop_t *)0x155305;
    run_test_fs_rename_to_existing_file_cold_17();
LAB_00155305:
    puStack_220 = (uv_loop_t *)0x15530a;
    run_test_fs_rename_to_existing_file_cold_18();
LAB_0015530a:
    puStack_220 = (uv_loop_t *)0x15530f;
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001552b5;
    puStack_220 = (uv_loop_t *)0x154fe1;
    uv_fs_req_cleanup(&open_req1);
    puStack_220 = (uv_loop_t *)0x154ff2;
    uVar15 = uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    puStack_220 = (uv_loop_t *)0x155030;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001552ba;
    if (write_req.result < 0) goto LAB_001552bf;
    puStack_220 = (uv_loop_t *)0x155052;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    puStack_220 = (uv_loop_t *)0x155068;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001552c4;
    if (close_req.result != 0) goto LAB_001552c9;
    puStack_220 = (uv_loop_t *)0x15508a;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    puStack_220 = (uv_loop_t *)0x1550ad;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001552ce;
    if (open_req1.result._4_4_ < 0) goto LAB_001552d3;
    puStack_220 = (uv_loop_t *)0x1550cf;
    uv_fs_req_cleanup(&open_req1);
    iVar4 = 0;
    puStack_220 = (uv_loop_t *)0x1550e5;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001552d8;
    if (close_req.result != 0) goto LAB_001552dd;
    puStack_220 = (uv_loop_t *)0x155107;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    puStack_220 = (uv_loop_t *)0x155126;
    iVar2 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001552e2;
    if (rename_req.result != 0) goto LAB_001552e7;
    puStack_220 = (uv_loop_t *)0x155148;
    uv_fs_req_cleanup(&rename_req);
    iVar4 = 0;
    puStack_220 = (uv_loop_t *)0x155165;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001552ec;
    if (open_req1.result._4_4_ < 0) goto LAB_001552f1;
    puStack_220 = (uv_loop_t *)0x155187;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_220 = (uv_loop_t *)0x1551a9;
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    puStack_220 = (uv_loop_t *)0x1551e7;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_001552f6;
    if (read_req.result < 0) goto LAB_001552fb;
    iVar4 = 0x2fbca0;
    puStack_220 = (uv_loop_t *)0x155210;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00155300;
    puStack_220 = (uv_loop_t *)0x155224;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    puStack_220 = (uv_loop_t *)0x15523a;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155305;
    if (close_req.result != 0) goto LAB_0015530a;
    puStack_220 = (uv_loop_t *)0x15525c;
    uv_fs_req_cleanup(&close_req);
    puStack_220 = (uv_loop_t *)0x155268;
    unlink("test_file");
    puStack_220 = (uv_loop_t *)0x155274;
    unlink("test_file2");
    puStack_220 = (uv_loop_t *)0x155279;
    puVar5 = uv_default_loop();
    puStack_220 = (uv_loop_t *)0x15528d;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_220 = (uv_loop_t *)0x155297;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_220 = (uv_loop_t *)0x15529c;
    puVar6 = uv_default_loop();
    puStack_220 = (uv_loop_t *)0x1552a4;
    iVar2 = uv_loop_close(puVar6);
    iVar4 = (int)puVar6;
    if (iVar2 == 0) {
      return 0;
    }
  }
  puStack_220 = (uv_loop_t *)run_test_fs_read_bufs;
  run_test_fs_rename_to_existing_file_cold_20();
  puStack_228 = (uv_fs_t *)0x15531a;
  puStack_220 = puVar5;
  fs_read_bufs(iVar4);
  puStack_228 = (uv_fs_t *)0x15531f;
  fs_read_bufs(iVar4);
  puStack_228 = (uv_fs_t *)0x155324;
  puVar5 = uv_default_loop();
  puStack_228 = (uv_fs_t *)0x155338;
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  puStack_228 = (uv_fs_t *)0x155342;
  uv_run(puVar5,UV_RUN_DEFAULT);
  puStack_228 = (uv_fs_t *)0x155347;
  puVar6 = uv_default_loop();
  puStack_228 = (uv_fs_t *)0x15534f;
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_228 = (uv_fs_t *)fs_read_bufs;
  run_test_fs_read_bufs_cold_1();
  iVar4 = 0;
  puStack_230 = puVar5;
  puStack_228 = unaff_R14;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fs_read_bufs_cold_1();
LAB_001555bb:
    fs_read_bufs_cold_2();
LAB_001555c0:
    fs_read_bufs_cold_3();
LAB_001555c5:
    fs_read_bufs_cold_4();
LAB_001555ca:
    fs_read_bufs_cold_5();
LAB_001555cf:
    fs_read_bufs_cold_6();
LAB_001555d4:
    fs_read_bufs_cold_7();
LAB_001555d9:
    fs_read_bufs_cold_8();
LAB_001555de:
    fs_read_bufs_cold_9();
LAB_001555e3:
    fs_read_bufs_cold_10();
LAB_001555e8:
    fs_read_bufs_cold_11();
LAB_001555ed:
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001555bb;
    uv_fs_req_cleanup(&open_req1);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,0,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001555c0;
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,1,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001555c5;
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_578,0,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001555ca;
    uStack_578 = uv_buf_init(acStack_538,0x100);
    uStack_568 = uv_buf_init(acStack_438,0x100);
    uStack_558 = uv_buf_init(acStack_338,0x80);
    uStack_548 = uv_buf_init(acStack_2b8,0x80);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_578,2,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0x1be) goto LAB_001555cf;
    if (read_req.result != 0x1be) goto LAB_001555d4;
    unaff_R14 = &read_req;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_558,2,0x100,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0xbe) goto LAB_001555d9;
    if (read_req.result != 0xbe) goto LAB_001555de;
    uv_fs_req_cleanup(&read_req);
    pcVar8 = uStack_568.base;
    pcVar12 = uStack_568.base;
    iVar2 = bcmp(uStack_568.base,uStack_558.base,0x80);
    iVar4 = (int)pcVar12;
    if (iVar2 != 0) goto LAB_001555e3;
    pcVar8 = pcVar8 + 0x80;
    iVar2 = bcmp(pcVar8,uStack_548.base,0x3e);
    iVar4 = (int)pcVar8;
    if (iVar2 != 0) goto LAB_001555e8;
    iVar4 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001555ed;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      return extraout_EAX_01;
    }
  }
  fs_read_bufs_cold_13();
  fs_read_file_eof(iVar4);
  fs_read_file_eof(iVar4);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_read_file_eof_cold_1();
  puVar9 = (uv_fs_t *)0x194395;
  puStack_5b0 = (uv_fs_t *)0x155653;
  unlink("test_file");
  puStack_5b0 = (uv_fs_t *)0x155658;
  loop = uv_default_loop();
  iVar4 = 0;
  puStack_5b0 = (uv_fs_t *)0x15567e;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    puStack_5b0 = (uv_fs_t *)0x1558db;
    fs_read_file_eof_cold_1();
LAB_001558db:
    puStack_5b0 = (uv_fs_t *)0x1558e0;
    fs_read_file_eof_cold_2();
LAB_001558e0:
    puStack_5b0 = (uv_fs_t *)0x1558e5;
    fs_read_file_eof_cold_3();
LAB_001558e5:
    puStack_5b0 = (uv_fs_t *)0x1558ea;
    fs_read_file_eof_cold_4();
LAB_001558ea:
    puStack_5b0 = (uv_fs_t *)0x1558ef;
    fs_read_file_eof_cold_5();
LAB_001558ef:
    puStack_5b0 = (uv_fs_t *)0x1558f4;
    fs_read_file_eof_cold_6();
LAB_001558f4:
    puStack_5b0 = (uv_fs_t *)0x1558f9;
    fs_read_file_eof_cold_7();
LAB_001558f9:
    puStack_5b0 = (uv_fs_t *)0x1558fe;
    fs_read_file_eof_cold_8();
LAB_001558fe:
    puStack_5b0 = (uv_fs_t *)0x155903;
    fs_read_file_eof_cold_9();
LAB_00155903:
    puStack_5b0 = (uv_fs_t *)0x155908;
    fs_read_file_eof_cold_10();
LAB_00155908:
    puStack_5b0 = (uv_fs_t *)0x15590d;
    fs_read_file_eof_cold_11();
LAB_0015590d:
    puStack_5b0 = (uv_fs_t *)0x155912;
    fs_read_file_eof_cold_12();
LAB_00155912:
    puStack_5b0 = (uv_fs_t *)0x155917;
    fs_read_file_eof_cold_13();
LAB_00155917:
    puStack_5b0 = (uv_fs_t *)0x15591c;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001558db;
    puStack_5b0 = (uv_fs_t *)0x1556a0;
    uv_fs_req_cleanup(&open_req1);
    puStack_5b0 = (uv_fs_t *)0x1556b1;
    uVar15 = uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    puStack_5b0 = (uv_fs_t *)0x1556ef;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001558e0;
    if (write_req.result < 0) goto LAB_001558e5;
    puStack_5b0 = (uv_fs_t *)0x155711;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    puStack_5b0 = (uv_fs_t *)0x155727;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001558ea;
    if (close_req.result != 0) goto LAB_001558ef;
    puStack_5b0 = (uv_fs_t *)0x155749;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    puStack_5b0 = (uv_fs_t *)0x155766;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001558f4;
    if (open_req1.result._4_4_ < 0) goto LAB_001558f9;
    puStack_5b0 = (uv_fs_t *)0x155788;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_5b0 = (uv_fs_t *)0x1557aa;
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    puStack_5b0 = (uv_fs_t *)0x1557e8;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_001558fe;
    if (read_req.result < 0) goto LAB_00155903;
    iVar4 = 0x2fbca0;
    puStack_5b0 = (uv_fs_t *)0x155811;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00155908;
    puVar9 = &read_req;
    puStack_5b0 = (uv_fs_t *)0x155828;
    uv_fs_req_cleanup(&read_req);
    puStack_5b0 = (uv_fs_t *)0x155839;
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    puStack_5b0 = (uv_fs_t *)0x155873;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,read_req.result,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015590d;
    if (read_req.result != 0) goto LAB_00155912;
    puStack_5b0 = (uv_fs_t *)0x155895;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    puStack_5b0 = (uv_fs_t *)0x1558ab;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155917;
    if (close_req.result == 0) {
      puStack_5b0 = (uv_fs_t *)0x1558c5;
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  puStack_5b0 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_5b8 = (uv_fs_t *)0x155927;
  puStack_5b0 = puVar9;
  fs_write_multiple_bufs(iVar4);
  puStack_5b8 = (uv_fs_t *)0x15592c;
  fs_write_multiple_bufs(iVar4);
  puStack_5b8 = (uv_fs_t *)0x155931;
  puVar5 = uv_default_loop();
  puStack_5b8 = (uv_fs_t *)0x155945;
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  puStack_5b8 = (uv_fs_t *)0x15594f;
  uv_run(puVar5,UV_RUN_DEFAULT);
  puStack_5b8 = (uv_fs_t *)0x155954;
  puVar6 = uv_default_loop();
  puStack_5b8 = (uv_fs_t *)0x15595c;
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_5b8 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  puStack_5c0 = puVar5;
  puStack_5b8 = unaff_R14;
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar4 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00155dfc:
    fs_write_multiple_bufs_cold_2();
LAB_00155e01:
    fs_write_multiple_bufs_cold_3();
LAB_00155e06:
    fs_write_multiple_bufs_cold_4();
LAB_00155e0b:
    fs_write_multiple_bufs_cold_5();
LAB_00155e10:
    fs_write_multiple_bufs_cold_6();
LAB_00155e15:
    fs_write_multiple_bufs_cold_7();
LAB_00155e1a:
    fs_write_multiple_bufs_cold_8();
LAB_00155e1f:
    fs_write_multiple_bufs_cold_9();
LAB_00155e24:
    fs_write_multiple_bufs_cold_10();
LAB_00155e29:
    fs_write_multiple_bufs_cold_11();
LAB_00155e2e:
    fs_write_multiple_bufs_cold_12();
LAB_00155e33:
    fs_write_multiple_bufs_cold_13();
LAB_00155e38:
    fs_write_multiple_bufs_cold_14();
LAB_00155e3d:
    fs_write_multiple_bufs_cold_15();
LAB_00155e42:
    fs_write_multiple_bufs_cold_16();
LAB_00155e47:
    fs_write_multiple_bufs_cold_19();
LAB_00155e4c:
    fs_write_multiple_bufs_cold_20();
LAB_00155e51:
    fs_write_multiple_bufs_cold_21();
LAB_00155e56:
    fs_write_multiple_bufs_cold_22();
LAB_00155e5b:
    fs_write_multiple_bufs_cold_23();
LAB_00155e60:
    fs_write_multiple_bufs_cold_24();
LAB_00155e65:
    fs_write_multiple_bufs_cold_25();
LAB_00155e6a:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00155dfc;
    uv_fs_req_cleanup(&open_req1);
    uStack_5e8 = uv_buf_init(test_buf,0xd);
    uStack_5d8 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&uStack_5e8,2,0,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155e01;
    if (write_req.result < 0) goto LAB_00155e06;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_00155e0b;
    if (close_req.result != 0) goto LAB_00155e10;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155e15;
    if (open_req1.result._4_4_ < 0) goto LAB_00155e1a;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    uStack_5e8 = uv_buf_init(buf,0xd);
    uStack_5d8 = uv_buf_init(buf2,0xf);
    iVar2 = (uv_file)open_req1.result;
    _Var7 = lseek64((uv_file)open_req1.result,0,1);
    if (_Var7 != 0) goto LAB_00155e1f;
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_5e8,2,-1,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155e24;
    if (read_req.result != 0x1c) goto LAB_00155e29;
    iVar2 = 0x2fbca0;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_00155e2e;
    iVar2 = 0x2fd090;
    iVar4 = strcmp(buf2,test_buf2);
    if (iVar4 != 0) goto LAB_00155e33;
    uv_fs_req_cleanup(&read_req);
    uVar15 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar15;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar4 != 0) goto LAB_00155e38;
    if (read_req.result != 0) goto LAB_00155e3d;
    uv_fs_req_cleanup(&read_req);
    uStack_5e8 = uv_buf_init(buf,0xd);
    uStack_5d8 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_5e8,2,0,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155e42;
    if (read_req.result == 0x1c) {
LAB_00155cfa:
      iVar2 = 0x2fbca0;
      iVar4 = strcmp(buf,test_buf);
      if (iVar4 != 0) goto LAB_00155e47;
      iVar2 = 0x2fd090;
      iVar4 = strcmp(buf2,test_buf2);
      if (iVar4 != 0) goto LAB_00155e4c;
      uv_fs_req_cleanup(&read_req);
      uVar15 = uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar15;
      iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0x1c,
                         (uv_fs_cb)0x0);
      if (iVar4 != 0) goto LAB_00155e51;
      if (read_req.result != 0) goto LAB_00155e56;
      uv_fs_req_cleanup(&read_req);
      iVar2 = 0;
      iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
      if (iVar4 != 0) goto LAB_00155e5b;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar2 = unlink("test_file");
        return iVar2;
      }
      goto LAB_00155e60;
    }
    if (read_req.result != 0xd) goto LAB_00155e65;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_5d8,1,
                       read_req.result,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155e6a;
    if (read_req.result == 0xf) goto LAB_00155cfa;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0xd4310;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_001561ec:
    fs_write_alotof_bufs_cold_18();
LAB_001561f1:
    fs_write_alotof_bufs_cold_1();
LAB_001561f6:
    fs_write_alotof_bufs_cold_2();
LAB_001561fb:
    fs_write_alotof_bufs_cold_3();
LAB_00156200:
    fs_write_alotof_bufs_cold_4();
LAB_00156205:
    fs_write_alotof_bufs_cold_17();
LAB_0015620a:
    fs_write_alotof_bufs_cold_5();
LAB_0015620f:
    fs_write_alotof_bufs_cold_6();
LAB_00156214:
    fs_write_alotof_bufs_cold_7();
LAB_00156219:
    fs_write_alotof_bufs_cold_8();
LAB_0015621e:
    fs_write_alotof_bufs_cold_9();
LAB_00156223:
    fs_write_alotof_bufs_cold_10();
LAB_00156228:
    fs_write_alotof_bufs_cold_12();
LAB_0015622d:
    fs_write_alotof_bufs_cold_13();
LAB_00156232:
    fs_write_alotof_bufs_cold_14();
LAB_00156237:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_001561f1;
    if (open_req1.result._4_4_ < 0) goto LAB_001561f6;
    uv_fs_req_cleanup(&open_req1);
    lVar11 = 8;
    do {
      uVar15 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar11 + -8) = uVar15.base;
      *(size_t *)((long)&bufs->base + lVar11) = uVar15.len;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_001561fb;
    if (write_req.result != 0xac67d) goto LAB_00156200;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_00156205;
    lVar11 = 8;
    pcVar12 = pcVar8;
    do {
      uVar15 = uv_buf_init(pcVar12,0xd);
      *(char **)((long)bufs + lVar11 + -8) = uVar15.base;
      *(size_t *)((long)&bufs->base + lVar11) = uVar15.len;
      lVar11 = lVar11 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar11 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_0015620a;
    if (close_req.result != 0) goto LAB_0015620f;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00156214;
    if (open_req1.result._4_4_ < 0) goto LAB_00156219;
    uv_fs_req_cleanup(&open_req1);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015621e;
    if (read_req.result != 0x3400) goto LAB_00156223;
    lVar11 = 0;
    do {
      pcVar12 = pcVar8 + lVar11;
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      iVar2 = (int)pcVar12;
      if (iVar4 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_001561ec;
      }
      lVar11 = lVar11 + 0xd;
    } while (lVar11 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pcVar8);
    iVar2 = (uv_file)open_req1.result;
    _Var7 = lseek64((uv_file)open_req1.result,write_req.result,0);
    if (_Var7 != write_req.result) goto LAB_00156228;
    uVar15 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar15;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar4 != 0) goto LAB_0015622d;
    if (read_req.result != 0) goto LAB_00156232;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_00156237;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(bufs);
      return extraout_EAX_02;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar6 = uv_default_loop();
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_670 = (uv_loop_t *)0x1562a0;
  unlink("test_file");
  puStack_670 = (uv_loop_t *)0x1562a5;
  loop = uv_default_loop();
  puStack_670 = (uv_loop_t *)0x1562b6;
  puVar6 = (uv_loop_t *)malloc(0xd4310);
  if (puVar6 == (uv_loop_t *)0x0) {
LAB_001565fb:
    puVar6 = puVar5;
    puStack_670 = (uv_loop_t *)0x156600;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00156600:
    puStack_670 = (uv_loop_t *)0x156605;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00156605:
    puStack_670 = (uv_loop_t *)0x15660a;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015660a:
    puStack_670 = (uv_loop_t *)0x15660f;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_0015660f:
    puStack_670 = (uv_loop_t *)0x156614;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00156614:
    puStack_670 = (uv_loop_t *)0x156619;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00156619:
    puStack_670 = (uv_loop_t *)0x15661e;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_0015661e:
    puStack_670 = (uv_loop_t *)0x156623;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00156623:
    puStack_670 = (uv_loop_t *)0x156628;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00156628:
    puStack_670 = (uv_loop_t *)0x15662d;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_0015662d:
    puStack_670 = (uv_loop_t *)0x156632;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00156632:
    puStack_670 = (uv_loop_t *)0x156637;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00156637:
    puStack_670 = (uv_loop_t *)0x15663c;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_0015663c:
    puStack_670 = (uv_loop_t *)0x156641;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00156641:
    puStack_670 = (uv_loop_t *)0x156646;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_670 = (uv_loop_t *)0x1562e5;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156600;
    if (open_req1.result._4_4_ < 0) goto LAB_00156605;
    puStack_670 = (uv_loop_t *)0x156307;
    uv_fs_req_cleanup(&open_req1);
    puStack_670 = (uv_loop_t *)0x156318;
    uVar15 = uv_buf_init("0123456789",10);
    puStack_670 = (uv_loop_t *)0x156356;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015660a;
    if (write_req.result != 10) goto LAB_0015660f;
    puStack_670 = (uv_loop_t *)0x156379;
    uv_fs_req_cleanup(&write_req);
    lVar11 = 8;
    do {
      puStack_670 = (uv_loop_t *)0x156393;
      uVar15 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar6->handle_queue + lVar11 + -0x18) = uVar15.base;
      *(size_t *)((long)puVar6->handle_queue + lVar11 + -0x10) = uVar15.len;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0xd4318);
    puStack_670 = (uv_loop_t *)0x1563d4;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar6,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156614;
    if (write_req.result != 0xac67d) goto LAB_00156619;
    puStack_670 = (uv_loop_t *)0x1563f9;
    uv_fs_req_cleanup(&write_req);
    puStack_670 = (uv_loop_t *)0x156403;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_0015661e;
    lVar11 = 8;
    pcVar12 = pcVar8;
    do {
      puStack_670 = (uv_loop_t *)0x156425;
      uVar15 = uv_buf_init(pcVar12,0xd);
      *(char **)((long)puVar6->handle_queue + lVar11 + -0x18) = uVar15.base;
      *(size_t *)((long)puVar6->handle_queue + lVar11 + -0x10) = uVar15.len;
      lVar11 = lVar11 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar11 != 0xd4318);
    puStack_670 = (uv_loop_t *)0x15646a;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar6,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156623;
    lVar11 = 0xd;
    if (iVar2 != 0xd) {
      lVar11 = 0x3400;
    }
    if (read_req.result != lVar11) goto LAB_00156628;
    pcVar12 = pcVar8;
    uVar10 = 0;
    do {
      puStack_670 = (uv_loop_t *)0x1564af;
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      if (iVar4 != 0) {
        puStack_670 = (uv_loop_t *)0x1565fb;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar5 = puVar6;
        goto LAB_001565fb;
      }
      if (iVar2 == 0xd) break;
      pcVar12 = pcVar12 + 0xd;
      bVar1 = uVar10 < 0x3ff;
      uVar10 = uVar10 + 1;
    } while (bVar1);
    puStack_670 = (uv_loop_t *)0x1564dc;
    uv_fs_req_cleanup(&read_req);
    puStack_670 = (uv_loop_t *)0x1564e4;
    free(pcVar8);
    puStack_670 = (uv_loop_t *)0x1564fb;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015662d;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00156632;
    puStack_670 = (uv_loop_t *)0x15652b;
    uv_fs_req_cleanup(&stat_req);
    puStack_670 = (uv_loop_t *)0x15653c;
    uVar15 = uv_buf_init(buf,0x20);
    puStack_670 = (uv_loop_t *)0x15657e;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156637;
    if (read_req.result != 0) goto LAB_0015663c;
    puStack_670 = (uv_loop_t *)0x1565a0;
    uv_fs_req_cleanup(&read_req);
    puStack_670 = (uv_loop_t *)0x1565b6;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156641;
    if (close_req.result == 0) {
      puStack_670 = (uv_loop_t *)0x1565d4;
      uv_fs_req_cleanup(&close_req);
      puStack_670 = (uv_loop_t *)0x1565e0;
      unlink("test_file");
      free(puVar6);
      return extraout_EAX_03;
    }
  }
  puStack_670 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_670 = puVar6;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_001567bd;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001567c2;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(acStack_672,2);
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_001567c7;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar2 = uv_loop_close(puVar5);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_001567d1;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_001567bd:
    run_test_fs_read_dir_cold_2();
LAB_001567c2:
    run_test_fs_read_dir_cold_3();
LAB_001567c7:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001567d1:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_scandir_file) {
  const char* path;
  int r;

  path = "test/fixtures/empty_file";
  loop = uv_default_loop();

  r = uv_fs_scandir(NULL, &scandir_req, path, 0, NULL);
  ASSERT(r == UV_ENOTDIR);
  uv_fs_req_cleanup(&scandir_req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, file_scandir_cb);
  ASSERT(r == 0);

  ASSERT(scandir_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}